

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::
pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
::append_realloc(pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                 *this,size_type n,
                left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *x)

{
  pointer __src;
  size_type sVar1;
  size_type sVar2;
  ebo *peVar3;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *last;
  int in_ESI;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *in_RDI;
  pointer temp;
  size_type new_cap;
  void *in_stack_ffffffffffffffb0;
  ebo *this_00;
  size_type in_stack_ffffffffffffffb8;
  ebo *in_stack_ffffffffffffffc0;
  
  sVar1 = grow_size((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                     *)in_stack_ffffffffffffffc0,(size_type)(in_stack_ffffffffffffffb8 >> 0x20));
  peVar3 = (ebo *)__gnu_cxx::
                  new_allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>
                  ::allocate((new_allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>
                              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb0);
  if ((in_RDI->ebo_).buf != (pointer)0x0) {
    __src = (in_RDI->ebo_).buf;
    in_stack_ffffffffffffffc0 = peVar3;
    sVar2 = size(in_RDI);
    memcpy(in_stack_ffffffffffffffc0,__src,(ulong)sVar2 * 0x18);
  }
  sVar2 = size(in_RDI);
  last = (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)
         ((long)peVar3 + (ulong)sVar2 * 0x18);
  this_00 = peVar3;
  size(in_RDI);
  detail::fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>
            ((left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)
             in_stack_ffffffffffffffc0,last,
             (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)this_00);
  ebo::release(this_00);
  (in_RDI->ebo_).buf = (pointer)peVar3;
  (in_RDI->ebo_).cap = sVar1;
  (in_RDI->ebo_).size = in_ESI + (in_RDI->ebo_).size;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}